

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::processAttributeGroupRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName,ComplexTypeInfo *typeInfo)

{
  SchemaInfo **enclosingSchema;
  uint saveScope;
  XSAnnotation *pXVar1;
  SchemaInfo *toRestore;
  bool bVar2;
  int namespaceURI;
  uint namespaceURI_00;
  DOMElement *pDVar3;
  XMLCh *pXVar4;
  XMLCh *name;
  XercesAttGroupInfo *fromAttGroup;
  SchemaInfo *pSVar5;
  ListType aListType;
  DOMElement *attGroupElem;
  XMLCh *local_48;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  pDVar3 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  aListType = IMPORT;
  pDVar3 = checkContent(this,elem,pDVar3,true,true);
  if (pDVar3 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x1f,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,(XMLCh *)0x0,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
  pXVar1 = this->fAnnotation;
  pXVar4 = getPrefix(this,refName);
  local_48 = refName;
  name = getLocalPart(this,refName);
  pXVar4 = resolvePrefixToURI(this,elem,pXVar4);
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  bVar2 = XMLString::equals(pXVar4,this->fTargetNSURIString);
  if (bVar2) {
    fromAttGroup = RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                             (this->fAttGroupRegistry,name);
    if (fromAttGroup == (XercesAttGroupInfo *)0x0) {
      aListType = INCLUDE;
      goto LAB_00318a2d;
    }
LAB_00318acf:
    copyAttGroupAttributes(this,elem,fromAttGroup,this->fCurrentAttGroupInfo,typeInfo);
    aListType = INCLUDE;
  }
  else {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,pXVar4);
    bVar2 = isImportingNS(this,namespaceURI);
    if (!bVar2) {
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,pXVar4,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00318c20;
    }
    fromAttGroup = traverseAttributeGroupDeclNS(this,elem,pXVar4,name);
    if (fromAttGroup != (XercesAttGroupInfo *)0x0) goto LAB_00318acf;
    pSVar5 = this->fSchemaInfo;
    namespaceURI_00 =
         (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                   (this->fURIStringPool,pXVar4);
    pSVar5 = SchemaInfo::getImportInfo(pSVar5,namespaceURI_00);
    if ((pSVar5 == (SchemaInfo *)0x0) || (pSVar5->fProcessed == true)) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x67,
                        (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,pXVar4,name,(XMLCh *)0x0);
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      goto LAB_00318c20;
    }
    restoreSchemaInfo(this,pSVar5,IMPORT,0xfffffffe);
LAB_00318a2d:
    attGroupElem = SchemaInfo::getTopLevelComponent
                             (*enclosingSchema,4,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,name,
                              enclosingSchema);
    if (attGroupElem != (DOMElement *)0x0) {
      bVar2 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::containsElement
                        (this->fDeclStack,&attGroupElem,0);
      if (bVar2) {
        fromAttGroup = (XercesAttGroupInfo *)0x0;
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x56,local_48,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        fromAttGroup = traverseAttributeGroupDecl(this,attGroupElem,typeInfo,true);
        if ((fromAttGroup != (XercesAttGroupInfo *)0x0) &&
           (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0)) {
          copyAttGroupAttributes
                    (this,elem,fromAttGroup,this->fCurrentAttGroupInfo,(ComplexTypeInfo *)0x0);
        }
        if (toRestore != *enclosingSchema) {
          restoreSchemaInfo(this,toRestore,aListType,saveScope);
        }
      }
      goto LAB_00318c20;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x67,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,pXVar4,name,(XMLCh *)0x0);
    fromAttGroup = (XercesAttGroupInfo *)0x0;
  }
  if (toRestore != *enclosingSchema) {
    restoreSchemaInfo(this,toRestore,aListType,0xfffffffe);
  }
LAB_00318c20:
  if (pXVar1 != (XSAnnotation *)0x0) {
    (*(pXVar1->super_XSerializable)._vptr_XSerializable[1])();
  }
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return fromAttGroup;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::processAttributeGroupRef(const DOMElement* const elem,
                                         const XMLCh* const refName,
                                         ComplexTypeInfo* const typeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem ,XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ATTRIBUTEGROUP);
    }

    Janitor<XSAnnotation> janAnnot(fAnnotation);
    const                XMLCh* prefix = getPrefix(refName);
    const                XMLCh* localPart = getLocalPart(refName);
    const                XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    XercesAttGroupInfo*  attGroupInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        attGroupInfo = traverseAttributeGroupDeclNS(elem, uriStr, localPart);

        if (!attGroupInfo) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                                  SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else {

        attGroupInfo = fAttGroupRegistry->get(localPart);
    }

    if (!attGroupInfo) {

        // traverse top level attributeGroup - if found
        DOMElement* attGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_AttributeGroup,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP, localPart, &fSchemaInfo);

        if (attGroupElem != 0) {

            // circular attribute check
            if (fDeclStack->containsElement(attGroupElem)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, refName);
                return 0;
            }

            attGroupInfo = traverseAttributeGroupDecl(attGroupElem, typeInfo, true);

            if (attGroupInfo && fCurrentAttGroupInfo) {
                copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, 0);
            }

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }

            return attGroupInfo;
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
        }
    }

    if (attGroupInfo) {
        copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, typeInfo);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType);
    }

    return attGroupInfo;
}